

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O0

ssize_t __thiscall
FIX::ThreadedSocketConnection::send
          (ThreadedSocketConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  socket_handle s;
  int iVar1;
  long lVar2;
  size_t length;
  ulong uVar3;
  ssize_t sent;
  int totalSent;
  string *msg_local;
  ThreadedSocketConnection *this_local;
  
  sent._4_4_ = 0;
  do {
    iVar1 = std::__cxx11::string::length();
    uVar3 = (ulong)sent._4_4_;
    if (iVar1 <= (int)sent._4_4_) {
      this_local._7_1_ = 1;
LAB_002b38f3:
      return CONCAT71((int7)(uVar3 >> 8),this_local._7_1_);
    }
    s = this->m_socket;
    lVar2 = std::__cxx11::string::c_str();
    length = std::__cxx11::string::length();
    uVar3 = socket_send(s,(char *)(lVar2 + (int)sent._4_4_),length);
    if ((long)uVar3 < 0) {
      this_local._7_1_ = 0;
      goto LAB_002b38f3;
    }
    sent._4_4_ = sent._4_4_ + (int)uVar3;
  } while( true );
}

Assistant:

bool ThreadedSocketConnection::send( const std::string& msg )
{
  int totalSent = 0;
  while(totalSent < (int)msg.length())
  {
    ssize_t sent = socket_send( m_socket, msg.c_str() + totalSent, msg.length() );
    if(sent < 0) return false;
    totalSent += sent;
  }

  return true;
}